

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  Tls *this_00;
  
  if (((this->super_BaseClient).m_pool.m_flags.super__Base_bitset<1UL>._M_w & 2) != 0) {
    this_00 = (Tls *)operator_new(0x878);
    Tls::Tls(this_00,this);
    this->m_tls = this_00;
  }
  iVar1 = resolve(this,&(this->super_BaseClient).m_pool.m_url.m_host);
  return iVar1;
}

Assistant:

void xmrig::Client::connect()
{
#   ifdef XMRIG_FEATURE_TLS
    if (m_pool.isTLS()) {
        m_tls = new Tls(this);
    }
#   endif

    resolve(m_pool.host());
}